

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeMe.hpp
# Opt level: O2

void SerializeMe::SerializeIntoBuffer<std::vector,Point3D,std::allocator<Point3D>>
               (SpanBytes *buffer,vector<Point3D,_std::allocator<Point3D>_> *vect)

{
  pointer pPVar1;
  Point3D *v;
  pointer value;
  uint32_t num_values;
  
  num_values = (uint32_t)
               (((long)(vect->super__Vector_base<Point3D,_std::allocator<Point3D>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(vect->super__Vector_base<Point3D,_std::allocator<Point3D>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x18);
  SerializeIntoBuffer<unsigned_int>(buffer,&num_values);
  pPVar1 = (vect->super__Vector_base<Point3D,_std::allocator<Point3D>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vect->super__Vector_base<Point3D,_std::allocator<Point3D>_>)._M_impl.
               super__Vector_impl_data._M_start; value != pPVar1; value = value + 1) {
    SerializeIntoBuffer<Point3D>(buffer,value);
  }
  return;
}

Assistant:

inline void SerializeIntoBuffer(SpanBytes& buffer, Container<T, TArgs...> const& vect)
{
  const auto num_values = static_cast<uint32_t>(vect.size());
  SerializeIntoBuffer(buffer, num_values);

  // can use memcpy if the size of T is 1
  if constexpr (sizeof(T) == 1 && is_vector<Container<T, TArgs...>>())
  {
    const size_t size = num_values;
    if (size > buffer.size())
    {
      throw std::runtime_error("SerializeIntoBuffer: buffer overflow");
    }
    memcpy(buffer.data(), vect.data(), size);
    buffer = SpanBytes(buffer.data() + size, buffer.size() - size);
  }
  else
  {
    for (const T& v : vect)
    {
      SerializeIntoBuffer(buffer, v);
    }
  }
}